

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O2

int cram_flush(cram_fd *fd)

{
  cram_container *c;
  int iVar1;
  
  iVar1 = -1;
  if (fd != (cram_fd *)0x0) {
    if ((fd->mode == 0x77) && (c = fd->ctr, c != (cram_container *)0x0)) {
      if (c->slice != (cram_slice *)0x0) {
        c->curr_slice = c->curr_slice + 1;
      }
      iVar1 = cram_flush_container_mt(fd,c);
      if (iVar1 == -1) {
        return -1;
      }
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int cram_flush(cram_fd *fd) {
    if (!fd)
	return -1;

    if (fd->mode == 'w' && fd->ctr) {
	if(fd->ctr->slice)
	    fd->ctr->curr_slice++;
	if (-1 == cram_flush_container_mt(fd, fd->ctr))
	    return -1;
    }

    return 0;
}